

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O1

Value * Kvm::addProc(Kvm *vm,Value *args)

{
  Value *pVVar1;
  long lVar2;
  
  if (vm->NIL != args) {
    lVar2 = 0;
    do {
      pVVar1 = args + 1;
      args = *(Value **)&args[1].type_;
      lVar2 = lVar2 + ((long)pVVar1->_vptr_Value >> 1);
    } while (args != vm->NIL);
    return (Value *)(lVar2 * 2 + 1);
  }
  return (Value *)0x1;
}

Assistant:

const Value* Kvm::addProc(Kvm *vm, const Value *args)
{
    long result {0};
    
    while (args != vm->NIL)
    {
        result += TK_INT(car(args));
        args = cdr(args);
    }
    return vm->makeFixnum(result);
}